

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

string * __thiscall
helics::ValueFederateManager::getTarget_abi_cxx11_(ValueFederateManager *this,Input *inp)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pthread_rwlock_t *__rwlock;
  string *psVar5;
  _Rb_tree_header *p_Var6;
  
  bVar1 = (this->inputTargets).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->inputTargets).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  p_Var3 = (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  psVar5 = (string *)emptyStr_abi_cxx11_;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var6 = &(this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header;
    iVar2 = (inp->super_Interface).handle.hid;
    p_Var4 = &p_Var6->_M_header;
    do {
      if (iVar2 <= (int)p_Var3[1]._M_color) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < iVar2];
    } while (p_Var3 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var4 != p_Var6) {
      psVar5 = (string *)emptyStr_abi_cxx11_;
      if ((int)p_Var4[1]._M_color <= iVar2) {
        psVar5 = (string *)&p_Var4[1]._M_parent;
      }
    }
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return psVar5;
}

Assistant:

const std::string& ValueFederateManager::getTarget(const Input& inp) const
{
    auto inpHandle = inputTargets.lock_shared();
    auto fnd = inpHandle->find(inp.handle);
    if (fnd != inpHandle->end()) {
        return fnd->second;
    }
    return emptyStr;
}